

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O2

void __thiscall vfs::posix_watcher::run(posix_watcher *this,bool folders,bool files)

{
  FILE *__stream;
  pointer puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long lVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> eventBuffer;
  string local_e8;
  _union_1457 local_c8;
  sigset_t local_c0;
  
  local_c8.sa_handler = (__sighandler_t)0x0;
  sigemptyset(&local_c0);
  sigaction(10,(sigaction *)&local_c8,(sigaction *)0x0);
  std::function<void_(const_vfs::path_&)>::operator()(&this->callback_,&this->dir_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&eventBuffer,0x1000,(allocator_type *)&local_e8);
  do {
    if (((this->running_)._M_base._M_i & 1U) == 0) {
LAB_001326ca:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&eventBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    sVar3 = read(this->inotifyFd_,
                 eventBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x1000);
    __stream = _stderr;
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      get_last_error_as_string_abi_cxx11_(&local_e8,*piVar4);
      fprintf(__stream,"[ error    ] read() of inotify file descriptor failed with error: %s\n",
              local_e8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_e8);
      goto LAB_001326ca;
    }
    for (iVar2 = 0;
        puVar1 = eventBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start, lVar5 = (long)iVar2, lVar5 < sVar3;
        iVar2 = *(int *)(puVar1 + lVar5 + 0xc) + iVar2 + 0x10) {
      if ((short)*(uint *)(eventBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar5 + 4) < 0) {
        if (((this->running_)._M_base._M_i & 1U) == 0) goto LAB_001326ca;
      }
      else if ((*(uint *)(eventBuffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5 + 4) >> 0x1e & 1) == 0) {
        if (*(int *)(eventBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar5 + 0xc) != 0 && files) {
LAB_00132676:
          std::function<void_(const_vfs::path_&)>::operator()(&this->callback_,&this->dir_);
        }
      }
      else if (folders) goto LAB_00132676;
    }
  } while( true );
}

Assistant:

void run(bool folders, bool files)
        {
            // This is set up to end the thread if killed by SIGUSR1.
            struct sigaction sa;
            sa.sa_handler   = nullptr;
            sa.sa_sigaction = nullptr;
            sigemptyset(&sa.sa_mask);
            sigaction(SIGUSR1, &sa, nullptr);

            // Call the callback in case we have some folders in there waiting before we started the process
            callback_(dir_);

            constexpr auto maxNumEventsToRead   = 128;
            constexpr auto eventSize            = sizeof(struct inotify_event);
            constexpr auto bufferLength         = maxNumEventsToRead*(eventSize+16);
            auto eventBuffer                    = std::vector<uint8_t>(bufferLength);

            while (running_)
            {
                // Multiple events can be read at a time.
                auto eventBufferOffset = 0;

                // Will block until a new event takes place.
                const auto sizeReadInBytes = read(inotifyFd_, eventBuffer.data(), bufferLength);
                if(sizeReadInBytes == -1)
                {
                    vfs_errorf("read() of inotify file descriptor failed with error: %s",
                               get_last_error_as_string(errno).c_str());
                    return;
                }

                while (eventBufferOffset < sizeReadInBytes)
                {
                    const auto pEvent = reinterpret_cast<struct inotify_event *>(&eventBuffer[eventBufferOffset]);

                    if ((pEvent->mask & IN_IGNORED) != 0)
                    {
                        // IN_IGNORED is set when the caller thread removes watch.
                        // This can also happen when the watched file/directory was deleted
                        // or the filesystem was unmounted.
                        if(running_ == false)
                        {
                            return;
                        }
                    }
                    else if((pEvent->mask & IN_ISDIR) != 0)
                    {
                        if (folders)
                        {
                            // A directory has been created/deleted.
                            callback_(dir_);
                        }
                    }
                    else if (pEvent->len != 0)
                    {
                        if (files)
                        {
                            // A file has been created/deleted.
                            callback_(dir_);
                        }
                    }

                    eventBufferOffset += eventSize + pEvent->len;
                }
            }
        }